

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O0

void __thiscall common::anon_unknown_0::CleanupHandler::disconnect(CleanupHandler *this)

{
  bool bVar1;
  function<void_()> *in_RDI;
  long in_FS_OFFSET;
  function<void_()> *pfVar2;
  function<void_()> *this_00;
  
  this_00 = *(function<void_()> **)(in_FS_OFFSET + 0x28);
  pfVar2 = in_RDI;
  bVar1 = std::function::operator_cast_to_bool(in_RDI);
  if (bVar1) {
    ::wallet::_GLOBAL__N_1::std::function<void_()>::operator()(in_RDI);
    std::function<void_()>::operator=(this_00,pfVar2);
  }
  if (*(function<void_()> **)(in_FS_OFFSET + 0x28) != this_00) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void disconnect() override { if (!m_cleanup) return; m_cleanup(); m_cleanup = nullptr; }